

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

RBFKernel * __thiscall CoreML::Specification::Kernel::mutable_rbfkernel(Kernel *this)

{
  RBFKernel *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    this_00 = (RBFKernel *)(this->kernel_).linearkernel_;
  }
  else {
    clear_kernel(this);
    this->_oneof_case_[0] = 2;
    this_00 = (RBFKernel *)operator_new(0x20);
    RBFKernel::RBFKernel(this_00);
    (this->kernel_).rbfkernel_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::RBFKernel* Kernel::mutable_rbfkernel() {
  if (!has_rbfkernel()) {
    clear_kernel();
    set_has_rbfkernel();
    kernel_.rbfkernel_ = new ::CoreML::Specification::RBFKernel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Kernel.rbfKernel)
  return kernel_.rbfkernel_;
}